

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

archive_acl_entry *
acl_new_entry(archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id)

{
  archive_acl_entry *local_38;
  archive_acl_entry *aq;
  archive_acl_entry *ap;
  wchar_t id_local;
  wchar_t tag_local;
  wchar_t permset_local;
  wchar_t type_local;
  archive_acl *acl_local;
  
  if ((type & 0x3c00U) == 0) {
    if ((type & 0x300U) == 0) {
      return (archive_acl_entry *)0x0;
    }
    if ((acl->acl_types & 0xfffffcffU) != 0) {
      return (archive_acl_entry *)0x0;
    }
    if ((permset & 0xfffffff8U) != 0) {
      return (archive_acl_entry *)0x0;
    }
  }
  else {
    if ((acl->acl_types & 0xffffc3ffU) != 0) {
      return (archive_acl_entry *)0x0;
    }
    if ((permset & 0x80ff0006U) != 0) {
      return (archive_acl_entry *)0x0;
    }
  }
  if (3 < (uint)(tag + L'\xffffd8ef')) {
    if ((uint)(tag + L'\xffffd8eb') < 2) {
      if ((type & 0xfffffcffU) != 0) {
        return (archive_acl_entry *)0x0;
      }
    }
    else {
      if (tag != L'❻') {
        return (archive_acl_entry *)0x0;
      }
      if ((type & 0xffffc3ffU) != 0) {
        return (archive_acl_entry *)0x0;
      }
    }
  }
  free(acl->acl_text_w);
  acl->acl_text_w = (wchar_t *)0x0;
  free(acl->acl_text);
  acl->acl_text = (char *)0x0;
  aq = acl->acl_head;
  local_38 = (archive_acl_entry *)0x0;
  while( true ) {
    if (aq == (archive_acl_entry *)0x0) {
      acl_local = (archive_acl *)calloc(1,0x80);
      if ((archive_acl_entry *)acl_local == (archive_acl_entry *)0x0) {
        acl_local = (archive_acl *)0x0;
      }
      else {
        if (local_38 == (archive_acl_entry *)0x0) {
          acl->acl_head = (archive_acl_entry *)acl_local;
        }
        else {
          local_38->next = (archive_acl_entry *)acl_local;
        }
        ((archive_acl_entry *)acl_local)->type = type;
        ((archive_acl_entry *)acl_local)->tag = tag;
        ((archive_acl_entry *)acl_local)->id = id;
        ((archive_acl_entry *)acl_local)->permset = permset;
        acl->acl_types = type | acl->acl_types;
      }
      return (archive_acl_entry *)acl_local;
    }
    if ((((((type & 0x3c00U) == 0) && (aq->type == type)) && (aq->tag == tag)) && (aq->id == id)) &&
       ((id != L'\xffffffff' || ((tag != L'✑' && (tag != L'✓')))))) break;
    local_38 = aq;
    aq = aq->next;
  }
  aq->permset = permset;
  return aq;
}

Assistant:

static struct archive_acl_entry *
acl_new_entry(struct archive_acl *acl,
    int type, int permset, int tag, int id)
{
	struct archive_acl_entry *ap, *aq;

	/* Type argument must be a valid NFS4 or POSIX.1e type.
	 * The type must agree with anything already set and
	 * the permset must be compatible. */
	if (type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
		if (acl->acl_types & ~ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			return (NULL);
		}
		if (permset &
		    ~(ARCHIVE_ENTRY_ACL_PERMS_NFS4
			| ARCHIVE_ENTRY_ACL_INHERITANCE_NFS4)) {
			return (NULL);
		}
	} else	if (type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
		if (acl->acl_types & ~ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
			return (NULL);
		}
		if (permset & ~ARCHIVE_ENTRY_ACL_PERMS_POSIX1E) {
			return (NULL);
		}
	} else {
		return (NULL);
	}

	/* Verify the tag is valid and compatible with NFS4 or POSIX.1e. */
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER:
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
	case ARCHIVE_ENTRY_ACL_GROUP:
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		/* Tags valid in both NFS4 and POSIX.1e */
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
	case ARCHIVE_ENTRY_ACL_OTHER:
		/* Tags valid only in POSIX.1e. */
		if (type & ~ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
			return (NULL);
		}
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		/* Tags valid only in NFS4. */
		if (type & ~ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			return (NULL);
		}
		break;
	default:
		/* No other values are valid. */
		return (NULL);
	}

	free(acl->acl_text_w);
	acl->acl_text_w = NULL;
	free(acl->acl_text);
	acl->acl_text = NULL;

	/*
	 * If there's a matching entry already in the list, overwrite it.
	 * NFSv4 entries may be repeated and are not overwritten.
	 *
	 * TODO: compare names of no id is provided (needs more rework)
	 */
	ap = acl->acl_head;
	aq = NULL;
	while (ap != NULL) {
		if (((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0) &&
		    ap->type == type && ap->tag == tag && ap->id == id) {
			if (id != -1 || (tag != ARCHIVE_ENTRY_ACL_USER &&
			    tag != ARCHIVE_ENTRY_ACL_GROUP)) {
				ap->permset = permset;
				return (ap);
			}
		}
		aq = ap;
		ap = ap->next;
	}

	/* Add a new entry to the end of the list. */
	ap = calloc(1, sizeof(*ap));
	if (ap == NULL)
		return (NULL);
	if (aq == NULL)
		acl->acl_head = ap;
	else
		aq->next = ap;
	ap->type = type;
	ap->tag = tag;
	ap->id = id;
	ap->permset = permset;
	acl->acl_types |= type;
	return (ap);
}